

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

bool __thiscall adios2::Engine::BetweenStepPairs(Engine *this)

{
  Engine *pointer;
  bool bVar1;
  allocator local_39;
  string local_38;
  
  pointer = this->m_Engine;
  std::__cxx11::string::string((string *)&local_38,"in call to Engine::BetweenStepPairs",&local_39);
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = (bool)adios2::core::Engine::BetweenStepPairs();
  return bVar1;
}

Assistant:

bool Engine::BetweenStepPairs()
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::BetweenStepPairs");
    return m_Engine->BetweenStepPairs();
}